

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O1

void __thiscall TestRunner::changeConsoleColor(TestRunner *this,ConsoleColors color)

{
  if (color < (Green|Red)) {
    Logger::print<>((wchar_t *)(&DAT_00151708 + *(int *)(&DAT_00151708 + (ulong)color * 4)));
    return;
  }
  return;
}

Assistant:

void TestRunner::changeConsoleColor(ConsoleColors color)
{
#ifdef _WIN32
	switch (color)
	{
	case ConsoleColors::White:
		SetConsoleTextAttribute(hstdout,0x7);
		break;
	case ConsoleColors::Red:
		SetConsoleTextAttribute(hstdout,(1 << 2) | (1 << 3));
		break;
	case ConsoleColors::Green:
		SetConsoleTextAttribute(hstdout,(1 << 1) | (1 << 3));
		break;
	}
#else
	switch (color)
	{
	case ConsoleColors::White:
		Logger::print(L"\033[1;0m");
		break;
	case ConsoleColors::Red:
		Logger::print(L"\033[1;31m");
		break;
	case ConsoleColors::Green:
		Logger::print(L"\033[1;32m");
		break;
	}
#endif
}